

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.cpp
# Opt level: O1

qsizetype __thiscall
QLatin1StringMatcher::indexIn_helper<QLatin1StringView>
          (QLatin1StringMatcher *this,QLatin1StringView haystack,qsizetype from)

{
  char *last;
  long lVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  R_conflict10 RVar10;
  QLatin1StringView haystack_00;
  QLatin1StringView needle;
  
  pcVar6 = (char *)haystack.m_size;
  pcVar8 = haystack.m_data;
  lVar1 = (this->m_pattern).m_size;
  if (pcVar6 != (char *)from || lVar1 != 0) {
    lVar9 = (from >> 0x3f & (ulong)pcVar6) + from;
    from = -1;
    if (lVar9 < (long)pcVar6) {
      last = pcVar8 + (long)pcVar6;
      pcVar5 = (this->m_pattern).m_data;
      if (this->m_cs == CaseSensitive) {
        RVar10 = QtPrivate::
                 q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
                 ::operator()((q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
                               *)&(this->field_2).m_caseSensitiveSearcher,pcVar8 + lVar9,last,pcVar5
                              ,pcVar5 + lVar1);
        from = -1;
        pcVar4 = RVar10.begin;
        if (RVar10.begin != last) {
LAB_001779ab:
          from = (long)pcVar4 - (long)pcVar8;
        }
      }
      else {
        lVar7 = 0x100;
        if (lVar1 < 0x100) {
          lVar7 = lVar1;
        }
        RVar10 = QtPrivate::
                 q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
                 ::operator()((q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
                               *)&(this->field_2).m_caseSensitiveSearcher,pcVar8 + lVar9,last,
                              this->m_foldBuffer,this->m_foldBuffer + lVar7);
        pcVar3 = RVar10.begin;
        if (pcVar3 != last) {
          needle.m_data = pcVar5 + lVar7;
          pcVar5 = pcVar3;
          do {
            pcVar4 = pcVar3;
            if (lVar1 - lVar7 < 1) goto LAB_001779ab;
            pcVar4 = pcVar5 + (lVar7 - (long)pcVar8);
            if ((long)pcVar6 <= (long)(pcVar5 + (lVar7 - (long)pcVar8))) {
              pcVar4 = pcVar6;
            }
            haystack_00.m_size = (long)pcVar6 - (long)pcVar4;
            haystack_00.m_data = pcVar8 + (long)pcVar4;
            needle.m_size = lVar1 - lVar7;
            bVar2 = QtPrivate::startsWith(haystack_00,needle,CaseInsensitive);
            pcVar4 = pcVar5;
            if (bVar2) goto LAB_001779ab;
            RVar10 = QtPrivate::
                     q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
                     ::operator()((q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
                                   *)&(this->field_2).m_caseSensitiveSearcher,pcVar5 + 1,last,
                                  this->m_foldBuffer,this->m_foldBuffer + lVar7);
            pcVar5 = RVar10.begin;
          } while (pcVar5 != last);
        }
        from = -1;
      }
    }
  }
  return from;
}

Assistant:

qsizetype QLatin1StringMatcher::indexIn_helper(String haystack, qsizetype from) const noexcept
{
    static_assert(QtPrivate::isLatin1OrUtf16View<String>);

    if (m_pattern.isEmpty() && from == haystack.size())
        return from;
    if (from < 0) // Historical behavior (see QString::indexOf and co.)
        from += haystack.size();
    if (from >= haystack.size())
        return -1;

    const auto start = [haystack] {
        if constexpr (std::is_same_v<String, QStringView>)
            return haystack.utf16();
        else
            return haystack.begin();
    }();

    auto begin = start + from;
    auto end = start + haystack.size();
    auto found = begin;
    if (m_cs == Qt::CaseSensitive) {
        found = m_caseSensitiveSearcher(begin, end, m_pattern.begin(), m_pattern.end()).begin;
        if (found == end)
            return -1;
    } else {
        const qsizetype bufferSize = std::min(m_pattern.size(), qsizetype(sizeof m_foldBuffer));
        const QLatin1StringView restNeedle = m_pattern.sliced(bufferSize);
        const bool needleLongerThanBuffer = restNeedle.size() > 0;
        String restHaystack = haystack;
        do {
            found = m_caseInsensitiveSearcher(found, end, m_foldBuffer, &m_foldBuffer[bufferSize])
                            .begin;
            if (found == end) {
                return -1;
            } else if (!needleLongerThanBuffer) {
                break;
            }
            restHaystack = haystack.sliced(
                    qMin(haystack.size(),
                         bufferSize + qsizetype(std::distance(start, found))));
            if (restHaystack.startsWith(restNeedle, Qt::CaseInsensitive))
                break;
            ++found;
        } while (true);
    }
    return std::distance(start, found);
}